

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedBindingCase::createBuffers(MixedBindingCase *this)

{
  code *pcVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar8;
  size_type sVar9;
  float *pfVar10;
  bool bVar11;
  float *local_160;
  Vector<float,_4> local_128;
  float *local_118;
  Vec4 *color;
  int local_108;
  int v;
  int x;
  int y;
  float local_f8 [2];
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  int local_a0;
  allocator<tcu::Vector<float,_4>_> local_99;
  int primNdx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  allocator<tcu::Vector<float,_4>_> local_69;
  undefined1 local_68 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positionData;
  int numColorOffsetElements;
  int numInstanceElementsPerCell;
  int numPositionElements;
  int numPositionCells;
  int numCells;
  bool instanced;
  Vec4 yellow;
  Vec4 green;
  Functions *gl;
  MixedBindingCase *this_local;
  long lVar7;
  
  pRVar6 = Context::getRenderContext((this->super_BindingRenderCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numCells,1.0,1.0,0.0,1.0);
  bVar11 = true;
  if (this->m_case != CASE_INSTANCED_BINDING) {
    bVar11 = this->m_case == CASE_INSTANCED_ATTRIB;
  }
  iVar4 = 400;
  if (bVar11) {
    iVar4 = 1;
  }
  positionData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)(byte)~bVar11 * 5 + 1;
  positionData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       positionData.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ * 400;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_69);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_68,
             (long)(iVar4 * 6),&local_69);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_69);
  iVar2 = (int)positionData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage * 2;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_99);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&primNdx,
             (long)iVar2,&local_99);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_99);
  for (local_a0 = 0; local_a0 < iVar4; local_a0 = local_a0 + 1) {
    tcu::Vector<float,_4>::Vector(&local_b0,0.0,0.0,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_68,(long)(local_a0 * 6));
    *(undefined8 *)pvVar8->m_data = local_b0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_b0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_c0,0.0,0.1,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_68,(long)(local_a0 * 6 + 1));
    *(undefined8 *)pvVar8->m_data = local_c0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_c0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_d0,0.1,0.1,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_68,(long)(local_a0 * 6 + 2));
    *(undefined8 *)pvVar8->m_data = local_d0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_d0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_e0,0.0,0.0,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_68,(long)(local_a0 * 6 + 3));
    *(undefined8 *)pvVar8->m_data = local_e0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_e0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_f0,0.1,0.1,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_68,(long)(local_a0 * 6 + 4));
    *(undefined8 *)pvVar8->m_data = local_f0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_f0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.1,0.0,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_68,(long)(local_a0 * 6 + 5));
    *(undefined8 *)pvVar8->m_data = _x;
    *(float (*) [2])(pvVar8->m_data + 2) = local_f8;
  }
  for (v = 0; v < 0x14; v = v + 1) {
    for (local_108 = 0; local_108 < 0x14; local_108 = local_108 + 1) {
      for (color._4_4_ = 0;
          color._4_4_ <
          positionData.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_; color._4_4_ = color._4_4_ + 1) {
        if ((local_108 + v) % 2 == 0) {
          local_160 = yellow.m_data + 2;
        }
        else {
          local_160 = (float *)&numCells;
        }
        local_118 = local_160;
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&primNdx,
                            (long)(((local_108 + v * 0x14) *
                                    positionData.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                   color._4_4_) * 2));
        uVar3 = *(undefined8 *)(local_160 + 2);
        *(undefined8 *)pvVar8->m_data = *(undefined8 *)local_160;
        *(undefined8 *)(pvVar8->m_data + 2) = uVar3;
        tcu::Vector<float,_4>::Vector
                  (&local_128,(float)local_108 / 20.0 + (float)local_108 / 20.0 + -1.0,
                   (float)v / 20.0 + (float)v / 20.0 + -1.0,0.0,0.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&primNdx,
                            (long)(((v * 0x14 + local_108) *
                                    positionData.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                   color._4_4_) * 2 + 1));
        *(undefined8 *)pvVar8->m_data = local_128.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_128.m_data._8_8_;
      }
    }
  }
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_posBuffer);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_posBuffer);
  pcVar1 = *(code **)(lVar7 + 0x150);
  sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     local_68);
  pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_68,0);
  pfVar10 = tcu::Vector<float,_4>::getPtr(pvVar8);
  (*pcVar1)(0x8892,(long)((int)sVar9 << 4),pfVar10,0x88e4);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x413);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_colorOffsetBuffer);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_colorOffsetBuffer);
  pcVar1 = *(code **)(lVar7 + 0x150);
  sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &primNdx);
  pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      &primNdx,0);
  pfVar10 = tcu::Vector<float,_4>::getPtr(pvVar8);
  (*pcVar1)(0x8892,(long)((int)sVar9 << 4),pfVar10,0x88e4);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x418);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&primNdx);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_68);
  return;
}

Assistant:

void MixedBindingCase::createBuffers (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green							= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow							= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	// draw grid. In instanced mode, each cell is an instance
	const bool				instanced						= (m_case == CASE_INSTANCED_BINDING) || (m_case == CASE_INSTANCED_ATTRIB);
	const int				numCells						= GRID_SIZE*GRID_SIZE;
	const int				numPositionCells				= (instanced) ? (1) : (numCells);
	const int				numPositionElements				= 6 * numPositionCells;
	const int				numInstanceElementsPerCell		= (instanced) ? (1) : (6);
	const int				numColorOffsetElements			= numInstanceElementsPerCell * numCells;

	std::vector<tcu::Vec4>	positionData					(numPositionElements);
	std::vector<tcu::Vec4>	colorOffsetData					(2 * numColorOffsetElements);

	// positions

	for (int primNdx = 0; primNdx < numPositionCells; ++primNdx)
	{
		positionData[primNdx*6 + 0] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 1] =  tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 2] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 3] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 4] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 5] =  tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}

	// color & offset

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		for (int v = 0; v < numInstanceElementsPerCell; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 0] = color;
			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_posBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_posBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(positionData.size() * sizeof(tcu::Vec4)), positionData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");

	gl.genBuffers(1, &m_colorOffsetBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");
}